

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

box3f * __thiscall pbrt::Sphere::getPrimBounds(Sphere *this,size_t param_2,affine3f *xfm)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined8 uVar9;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  box3f *in_RDI;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar37;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar41 [16];
  float fVar42;
  float fVar43;
  undefined1 auVar44 [16];
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar48 [16];
  float fVar52;
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 auVar53 [16];
  float fVar57;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 auVar58 [16];
  float fVar62;
  float fVar64;
  float fVar65;
  float fVar66;
  undefined1 auVar63 [16];
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  
  fVar28 = (this->transform).l.vx.x;
  fVar46 = (xfm->l).vx.z;
  uVar1 = (this->transform).l.vx.y;
  uVar10 = (this->transform).l.vx.z;
  fVar18 = (xfm->l).vy.z;
  fVar22 = (xfm->l).vz.z;
  fVar38 = (float)uVar10 * fVar22 + fVar28 * fVar46 + (float)uVar1 * fVar18;
  fVar19 = (this->transform).l.vy.x;
  uVar2 = (this->transform).l.vy.y;
  uVar11 = (this->transform).l.vy.z;
  fVar45 = fVar22 * (float)uVar11 + fVar46 * fVar19 + fVar18 * (float)uVar2;
  fVar20 = (this->transform).l.vz.x;
  uVar3 = (this->transform).l.vz.y;
  uVar12 = (this->transform).l.vz.z;
  fVar42 = fVar22 * (float)uVar12 + fVar46 * fVar20 + fVar18 * (float)uVar3;
  uVar4 = (this->transform).p.x;
  uVar13 = (this->transform).p.y;
  uVar9 = *(undefined8 *)&(this->transform).p.z;
  uVar5 = (xfm->l).vx.x;
  uVar14 = (xfm->l).vx.y;
  uVar6 = (xfm->l).vy.x;
  uVar15 = (xfm->l).vy.y;
  uVar7 = (xfm->l).vz.x;
  uVar16 = (xfm->l).vz.y;
  fVar62 = (float)uVar10 * (float)uVar7 + (float)uVar1 * (float)uVar6 + fVar28 * (float)uVar5;
  fVar64 = (float)uVar10 * (float)uVar16 + (float)uVar1 * (float)uVar15 + fVar28 * (float)uVar14;
  fVar65 = (float)uVar10 * 0.0 + (float)uVar1 * 0.0 + fVar28 * 0.0;
  fVar66 = (float)uVar10 * 0.0 + (float)uVar1 * 0.0 + fVar28 * 0.0;
  fVar37 = (float)uVar9;
  fVar40 = (float)((ulong)uVar9 >> 0x20);
  fVar47 = (float)uVar11 * (float)uVar7 + (float)uVar2 * (float)uVar6 + fVar19 * (float)uVar5;
  fVar49 = (float)uVar11 * (float)uVar16 + (float)uVar2 * (float)uVar15 + fVar19 * (float)uVar14;
  fVar50 = (float)uVar11 * 0.0 + (float)uVar2 * 0.0 + fVar19 * 0.0;
  fVar51 = (float)uVar11 * 0.0 + (float)uVar2 * 0.0 + fVar19 * 0.0;
  fVar28 = -fVar40;
  fVar39 = fVar38 * fVar28;
  fVar52 = (float)uVar12 * (float)uVar7 + (float)uVar3 * (float)uVar6 + fVar20 * (float)uVar5;
  fVar54 = (float)uVar12 * (float)uVar16 + (float)uVar3 * (float)uVar15 + fVar20 * (float)uVar14;
  fVar55 = (float)uVar12 * 0.0 + (float)uVar3 * 0.0 + fVar20 * 0.0;
  fVar56 = (float)uVar12 * 0.0 + (float)uVar3 * 0.0 + fVar20 * 0.0;
  fVar43 = fVar42 * fVar40;
  fVar67 = fVar40 * fVar52;
  fVar68 = fVar40 * fVar54;
  fVar69 = fVar40 * fVar55;
  fVar70 = fVar40 * fVar56;
  fVar52 = fVar52 * fVar28;
  fVar54 = fVar54 * fVar28;
  fVar55 = fVar55 * fVar28;
  fVar56 = fVar56 * fVar28;
  fVar19 = fVar40 * fVar47;
  fVar25 = fVar40 * fVar49;
  fVar26 = fVar40 * fVar50;
  fVar27 = fVar40 * fVar51;
  fVar47 = fVar47 * fVar28;
  fVar49 = fVar49 * fVar28;
  fVar50 = fVar50 * fVar28;
  fVar51 = fVar51 * fVar28;
  fVar57 = fVar28 * fVar62;
  fVar59 = fVar28 * fVar64;
  fVar60 = fVar28 * fVar65;
  fVar61 = fVar28 * fVar66;
  fVar62 = fVar62 * fVar40;
  fVar64 = fVar64 * fVar40;
  fVar65 = fVar65 * fVar40;
  fVar66 = fVar66 * fVar40;
  fVar20 = fVar40 * fVar45;
  fVar45 = fVar45 * fVar28;
  fVar42 = fVar42 * fVar28;
  fVar21 = fVar20 + fVar39;
  fVar39 = fVar39 + fVar45;
  fVar38 = fVar38 * fVar40;
  fVar20 = fVar20 + fVar38;
  fVar28 = (xfm->p).z + fVar18 * (float)uVar13 + fVar46 * (float)uVar4 + fVar22 * fVar37;
  fVar18 = fVar39 + fVar42 + fVar28;
  fVar46 = fVar18;
  if (3.4028235e+38 <= fVar18) {
    fVar46 = 3.4028235e+38;
  }
  fVar40 = fVar39 + fVar43 + fVar28;
  fVar22 = fVar40;
  if (fVar46 <= fVar40) {
    fVar22 = fVar46;
  }
  if (fVar18 <= -3.4028235e+38) {
    fVar18 = -3.4028235e+38;
  }
  if (fVar40 <= fVar18) {
    fVar40 = fVar18;
  }
  fVar18 = fVar21 + fVar42 + fVar28;
  fVar46 = fVar18;
  if (fVar22 <= fVar18) {
    fVar46 = fVar22;
  }
  if (fVar18 <= fVar40) {
    fVar18 = fVar40;
  }
  fVar22 = fVar21 + fVar43 + fVar28;
  fVar21 = fVar22;
  if (fVar46 <= fVar22) {
    fVar21 = fVar46;
  }
  if (fVar22 <= fVar18) {
    fVar22 = fVar18;
  }
  fVar38 = fVar38 + fVar45;
  fVar18 = fVar42 + fVar38 + fVar28;
  fVar46 = fVar18;
  if (fVar21 <= fVar18) {
    fVar46 = fVar21;
  }
  if (fVar18 <= fVar22) {
    fVar18 = fVar22;
  }
  fVar22 = fVar38 + fVar43 + fVar28;
  fVar21 = fVar22;
  if (fVar46 <= fVar22) {
    fVar21 = fVar46;
  }
  if (fVar22 <= fVar18) {
    fVar22 = fVar18;
  }
  fVar46 = fVar42 + fVar20 + fVar28;
  fVar18 = fVar46;
  if (fVar21 <= fVar46) {
    fVar18 = fVar21;
  }
  if (fVar46 <= fVar22) {
    fVar46 = fVar22;
  }
  fVar28 = fVar20 + fVar43 + fVar28;
  uVar8 = (xfm->p).x;
  uVar17 = (xfm->p).y;
  fVar40 = (float)uVar8 +
           fVar37 * (float)uVar7 + (float)uVar13 * (float)uVar6 + (float)uVar4 * (float)uVar5;
  fVar38 = (float)uVar17 +
           fVar37 * (float)uVar16 + (float)uVar13 * (float)uVar15 + (float)uVar4 * (float)uVar14;
  fVar39 = fVar37 * 0.0 + (float)uVar13 * 0.0 + (float)uVar4 * 0.0 + 0.0;
  fVar42 = fVar37 * 0.0 + (float)uVar13 * 0.0 + (float)uVar4 * 0.0 + 0.0;
  fVar22 = fVar57 + fVar47;
  fVar20 = fVar59 + fVar49;
  fVar21 = fVar60 + fVar50;
  fVar37 = fVar61 + fVar51;
  auVar23._0_8_ = CONCAT44(fVar20 + fVar54 + fVar38,fVar22 + fVar52 + fVar40);
  auVar23._8_4_ = fVar21 + fVar55 + fVar39;
  auVar23._12_4_ = fVar37 + fVar56 + fVar42;
  auVar36._8_4_ = auVar23._8_4_;
  auVar36._0_8_ = auVar23._0_8_;
  auVar36._12_4_ = auVar23._12_4_;
  auVar29 = minps(auVar36,_DAT_0014c340);
  auVar35._0_8_ = CONCAT44(fVar20 + fVar68 + fVar38,fVar22 + fVar67 + fVar40);
  auVar35._8_4_ = fVar21 + fVar69 + fVar39;
  auVar35._12_4_ = fVar37 + fVar70 + fVar42;
  auVar33._8_4_ = auVar35._8_4_;
  auVar33._0_8_ = auVar35._0_8_;
  auVar33._12_4_ = auVar35._12_4_;
  auVar34 = minps(auVar33,auVar29);
  auVar23 = maxps(auVar23,_DAT_0014c350);
  auVar36 = maxps(auVar35,auVar23);
  fVar57 = fVar57 + fVar19;
  fVar59 = fVar59 + fVar25;
  fVar60 = fVar60 + fVar26;
  fVar61 = fVar61 + fVar27;
  auVar41._0_8_ = CONCAT44(fVar59 + fVar54 + fVar38,fVar57 + fVar52 + fVar40);
  auVar41._8_4_ = fVar60 + fVar55 + fVar39;
  auVar41._12_4_ = fVar61 + fVar56 + fVar42;
  auVar29._8_4_ = auVar41._8_4_;
  auVar29._0_8_ = auVar41._0_8_;
  auVar29._12_4_ = auVar41._12_4_;
  auVar23 = minps(auVar29,auVar34);
  auVar58._0_8_ = CONCAT44(fVar59 + fVar68 + fVar38,fVar57 + fVar67 + fVar40);
  auVar58._8_4_ = fVar60 + fVar69 + fVar39;
  auVar58._12_4_ = fVar61 + fVar70 + fVar42;
  auVar30._8_4_ = auVar58._8_4_;
  auVar30._0_8_ = auVar58._0_8_;
  auVar30._12_4_ = auVar58._12_4_;
  auVar23 = minps(auVar30,auVar23);
  fVar47 = fVar47 + fVar62;
  fVar49 = fVar49 + fVar64;
  fVar50 = fVar50 + fVar65;
  fVar51 = fVar51 + fVar66;
  auVar44._0_8_ = CONCAT44(fVar49 + fVar54 + fVar38,fVar47 + fVar52 + fVar40);
  auVar44._8_4_ = fVar50 + fVar55 + fVar39;
  auVar44._12_4_ = fVar51 + fVar56 + fVar42;
  auVar34._8_4_ = auVar44._8_4_;
  auVar34._0_8_ = auVar44._0_8_;
  auVar34._12_4_ = auVar44._12_4_;
  auVar23 = minps(auVar34,auVar23);
  auVar48._0_8_ = CONCAT44(fVar49 + fVar68 + fVar38,fVar47 + fVar67 + fVar40);
  auVar48._8_4_ = fVar50 + fVar69 + fVar39;
  auVar48._12_4_ = fVar51 + fVar70 + fVar42;
  auVar31._8_4_ = auVar48._8_4_;
  auVar31._0_8_ = auVar48._0_8_;
  auVar31._12_4_ = auVar48._12_4_;
  auVar23 = minps(auVar31,auVar23);
  fVar62 = fVar62 + fVar19;
  fVar64 = fVar64 + fVar25;
  fVar65 = fVar65 + fVar26;
  fVar66 = fVar66 + fVar27;
  auVar53._0_8_ = CONCAT44(fVar54 + fVar64 + fVar38,fVar52 + fVar62 + fVar40);
  auVar53._8_4_ = fVar55 + fVar65 + fVar39;
  auVar53._12_4_ = fVar56 + fVar66 + fVar42;
  auVar24._8_4_ = auVar53._8_4_;
  auVar24._0_8_ = auVar53._0_8_;
  auVar24._12_4_ = auVar53._12_4_;
  auVar23 = minps(auVar24,auVar23);
  auVar63._0_8_ = CONCAT44(fVar64 + fVar68 + fVar38,fVar62 + fVar67 + fVar40);
  auVar63._8_4_ = fVar65 + fVar69 + fVar39;
  auVar63._12_4_ = fVar66 + fVar70 + fVar42;
  auVar32._8_4_ = auVar63._8_4_;
  auVar32._0_8_ = auVar63._0_8_;
  auVar32._12_4_ = auVar63._12_4_;
  auVar23 = minps(auVar32,auVar23);
  fVar22 = fVar28;
  if (fVar18 <= fVar28) {
    fVar22 = fVar18;
  }
  (in_RDI->lower).x = (float)(int)auVar23._0_8_;
  (in_RDI->lower).y = (float)(int)((ulong)auVar23._0_8_ >> 0x20);
  (in_RDI->lower).z = fVar22;
  auVar23 = maxps(auVar41,auVar36);
  auVar23 = maxps(auVar58,auVar23);
  auVar23 = maxps(auVar44,auVar23);
  auVar23 = maxps(auVar48,auVar23);
  auVar23 = maxps(auVar53,auVar23);
  auVar23 = maxps(auVar63,auVar23);
  if (fVar28 <= fVar46) {
    fVar28 = fVar46;
  }
  (in_RDI->upper).x = (float)(int)auVar23._0_8_;
  (in_RDI->upper).y = (float)(int)((ulong)auVar23._0_8_ >> 0x20);
  (in_RDI->upper).z = fVar28;
  return in_RDI;
}

Assistant:

box3f Sphere::getPrimBounds(const size_t /*unused: primID*/, const affine3f &xfm) 
  {
    box3f ob(vec3f(-radius),vec3f(+radius));
    affine3f _xfm = xfm * transform;
      
    box3f bounds = box3f::empty_box();
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.lower.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.lower.y,ob.upper.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.upper.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.upper.y,ob.upper.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.lower.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.lower.y,ob.upper.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.upper.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.upper.y,ob.upper.z)));
    return bounds;
  }